

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::BaseModeFunction<duckdb::ModeStandard<float>>::
     Combine<duckdb::ModeState<float,duckdb::ModeStandard<float>>,duckdb::ModeFunction<duckdb::ModeStandard<float>>>
               (ModeState<float,_duckdb::ModeStandard<float>_> *source,
               ModeState<float,_duckdb::ModeStandard<float>_> *target,AggregateInputData *param_3)

{
  bool bVar1;
  unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
  *puVar2;
  reference ppVar3;
  unsigned_long uVar4;
  long in_RSI;
  long in_RDI;
  mapped_type *i;
  pair<const_float,_duckdb::ModeAttr> *val;
  iterator __end0;
  iterator __begin0;
  Counts *__range3;
  unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
  *in_stack_ffffffffffffffa8;
  mapped_type *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_float,_duckdb::ModeAttr>,_false> local_40;
  _Node_iterator_base<std::pair<const_float,_duckdb::ModeAttr>,_false> local_38;
  undefined8 local_30;
  long local_10;
  long local_8;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (*(long *)(in_RSI + 0x18) == 0) {
      puVar2 = (unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
                *)operator_new(0x38);
      std::
      unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
      ::unordered_map((unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
                       *)in_stack_ffffffffffffffb0,puVar2);
      *(unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
        **)(local_10 + 0x18) = puVar2;
      *(undefined8 *)(local_10 + 0x38) = *(undefined8 *)(local_8 + 0x38);
    }
    else {
      local_30 = *(undefined8 *)(in_RDI + 0x18);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
           ::begin(in_stack_ffffffffffffffa8);
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
           ::end(in_stack_ffffffffffffffa8);
      while (bVar1 = std::__detail::operator!=(&local_38,&local_40), bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_float,_duckdb::ModeAttr>,_false,_false>::operator*
                           ((_Node_iterator<std::pair<const_float,_duckdb::ModeAttr>,_false,_false>
                             *)0xb26bff);
        in_stack_ffffffffffffffb0 =
             std::
             unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
             ::operator[]((unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
                           *)in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffb0->count = (ppVar3->second).count + in_stack_ffffffffffffffb0->count
        ;
        uVar4 = MinValue<unsigned_long>
                          (in_stack_ffffffffffffffb0->first_row,(ppVar3->second).first_row);
        in_stack_ffffffffffffffb0->first_row = uVar4;
        std::__detail::_Node_iterator<std::pair<const_float,_duckdb::ModeAttr>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_float,_duckdb::ModeAttr>,_false,_false> *)
                   in_stack_ffffffffffffffb0);
      }
      *(long *)(local_10 + 0x38) = *(long *)(local_8 + 0x38) + *(long *)(local_10 + 0x38);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.frequency_map) {
			return;
		}
		if (!target.frequency_map) {
			// Copy - don't destroy! Otherwise windowing will break.
			target.frequency_map = new typename STATE::Counts(*source.frequency_map);
			target.count = source.count;
			return;
		}
		for (auto &val : *source.frequency_map) {
			auto &i = (*target.frequency_map)[val.first];
			i.count += val.second.count;
			i.first_row = MinValue(i.first_row, val.second.first_row);
		}
		target.count += source.count;
	}